

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O0

Point2D __thiscall
lazyTrees::LazyKdTree<Point2D>::nearest(LazyKdTree<Point2D> *this,Point2D *search)

{
  bool bVar1;
  Compare CVar2;
  pointer pPVar3;
  double *pdVar4;
  LazyKdTree<Point2D> *in_RSI;
  double dVar5;
  unique_ptr<Point2D,_std::default_delete<Point2D>_> *this_00;
  double dVar6;
  Point2D PVar7;
  Point2D otherBest_1;
  Point2D otherBest;
  double borderPositive;
  double borderNegative;
  double distanceBest;
  double sqrDistanceThis;
  double sqrDistanceBest;
  Point2D best;
  Compare comp;
  size_t in_stack_ffffffffffffff28;
  LazyKdTree<Point2D> *in_stack_ffffffffffffff30;
  Point2D *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  Point2D *in_stack_ffffffffffffff48;
  LazyKdTree<Point2D> *this_01;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  LazyKdTree<Point2D> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  LazyKdTree<Point2D> *this_02;
  double local_10;
  double local_8;
  
  ensure_evaluated(in_stack_ffffffffffffffd0);
  bVar1 = is_leaf(in_stack_ffffffffffffff30);
  if (bVar1) {
    pPVar3 = std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
                       ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)
                        in_stack_ffffffffffffff30);
    local_10 = pPVar3->x;
    local_8 = pPVar3->y;
  }
  else {
    this_01 = in_RSI;
    std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
              ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)in_stack_ffffffffffffff30);
    CVar2 = dimension_compare(in_stack_ffffffffffffff38,(Point2D *)in_stack_ffffffffffffff30,
                              in_stack_ffffffffffffff28);
    Point2D::Point2D((Point2D *)&local_38);
    if ((CVar2 == NEGATIVE) &&
       (bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                            *)0x1b1ea0), bVar1)) {
      std::
      unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                    *)0x1b1eb4);
      PVar7 = nearest(this_01,(Point2D *)CONCAT44(CVar2,in_stack_ffffffffffffffd8));
      local_48 = PVar7.x;
      local_38 = local_48;
      local_40 = PVar7.y;
      local_50 = local_40;
    }
    else {
      if ((CVar2 != POSITIVE) ||
         (bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                              *)0x1b1f13), !bVar1)) {
        pPVar3 = std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
                           ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)
                            in_stack_ffffffffffffff30);
        local_10 = pPVar3->x;
        local_8 = pPVar3->y;
        goto LAB_001b2264;
      }
      std::
      unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                    *)0x1b1f27);
      PVar7 = nearest(this_01,(Point2D *)CONCAT44(CVar2,in_stack_ffffffffffffffd8));
      local_58 = PVar7.x;
      local_38 = local_58;
      local_50 = PVar7.y;
    }
    local_60 = square_dist((Point2D *)in_RSI,in_stack_ffffffffffffff48);
    this_02 = this_01;
    std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
              ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)in_stack_ffffffffffffff30);
    dVar5 = square_dist((Point2D *)in_RSI,(Point2D *)this_01);
    local_98 = local_50;
    if (dVar5 < local_60) {
      pPVar3 = std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
                         ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)
                          in_stack_ffffffffffffff30);
      local_38 = pPVar3->x;
      local_98 = pPVar3->y;
      local_60 = dVar5;
    }
    dVar5 = sqrt(local_60);
    pdVar4 = Point2D::operator[]((Point2D *)this_01,in_stack_ffffffffffffff40);
    this_00 = (unique_ptr<Point2D,_std::default_delete<Point2D>_> *)(*pdVar4 - dVar5);
    pdVar4 = Point2D::operator[]((Point2D *)this_01,in_stack_ffffffffffffff40);
    dVar5 = *pdVar4 + dVar5;
    if ((CVar2 == NEGATIVE) &&
       (bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                            *)0x1b209f), bVar1)) {
      std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get
                ((unique_ptr<Point2D,_std::default_delete<Point2D>_> *)in_stack_ffffffffffffff30);
      pdVar4 = Point2D::operator[]((Point2D *)this_01,(size_t)dVar5);
      if (*pdVar4 <= dVar5) {
        std::
        unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                      *)0x1b20ed);
        PVar7 = nearest(this_02,(Point2D *)CONCAT44(CVar2,in_stack_ffffffffffffffd8));
        dVar5 = square_dist((Point2D *)in_RSI,(Point2D *)this_01);
        dVar6 = square_dist((Point2D *)in_RSI,(Point2D *)this_01);
        if (dVar5 < dVar6) {
          local_90 = PVar7.x;
          local_38 = local_90;
          local_88 = PVar7.y;
          local_98 = local_88;
        }
      }
    }
    else if ((CVar2 == POSITIVE) &&
            (bVar1 = std::unique_ptr::operator_cast_to_bool
                               ((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                                 *)0x1b217f), bVar1)) {
      std::unique_ptr<Point2D,_std::default_delete<Point2D>_>::get(this_00);
      pdVar4 = Point2D::operator[]((Point2D *)this_01,in_stack_ffffffffffffff40);
      if ((double)this_00 <= *pdVar4) {
        std::
        unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
        ::operator->((unique_ptr<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                      *)0x1b21d1);
        PVar7 = nearest(this_02,(Point2D *)CONCAT44(CVar2,in_stack_ffffffffffffffd8));
        dVar5 = square_dist((Point2D *)in_RSI,(Point2D *)this_01);
        dVar6 = square_dist((Point2D *)in_RSI,(Point2D *)this_01);
        if (dVar5 < dVar6) {
          local_a0 = PVar7.x;
          local_38 = local_a0;
          local_98 = PVar7.y;
        }
      }
    }
    local_10 = local_38;
    local_8 = local_98;
  }
LAB_001b2264:
  PVar7.y = local_8;
  PVar7.x = local_10;
  return PVar7;
}

Assistant:

P nearest(P const& search)
    {
        ensure_evaluated();

        if (is_leaf())
            return *data.get(); // reached the end, return current value

        const auto comp = dimension_compare(search, *data.get(), dim);

        P best; // nearest neighbor of search

        if (comp == NEGATIVE && childNegative)
            best = childNegative->nearest(search);
        else if (comp == POSITIVE && childPositive)
            best = childPositive->nearest(search);
        else
            return *data.get();

        double sqrDistanceBest = square_dist(search, best);
        const double sqrDistanceThis = square_dist(search, *data.get());

        if (sqrDistanceThis < sqrDistanceBest) {
            sqrDistanceBest = sqrDistanceThis;
            best = *data.get(); // make this value the best if it is closer than the
            // checked side
            // type
        }

        // check whether other side might have candidates as well
        const double distanceBest   = std::sqrt(sqrDistanceBest);
        const double borderNegative = search[dim] - distanceBest;
        const double borderPositive = search[dim] + distanceBest;

        // check whether distances to other side are smaller than currently best
        // and recurse into the "wrong" direction, to check for possibly additional
        // candidates
        if (comp == NEGATIVE && childPositive) {
            if (borderPositive >= (*data.get())[dim]) {
                const auto otherBest = childPositive->nearest(search);
                if (square_dist(search, otherBest) < square_dist(search, best))
                    best = otherBest;
            }
        } else if (comp == POSITIVE && childNegative) {
            if (borderNegative <= (*data.get())[dim]) {
                const auto otherBest = childNegative->nearest(search);
                if (square_dist(search, otherBest) < square_dist(search, best))
                    best = otherBest;
            }
        }

        return best;
    }